

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# islamcal.cpp
# Opt level: O2

int __thiscall
icu_63::IslamicCalendar::clone
          (IslamicCalendar *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  IslamicCalendar *this_00;
  
  this_00 = (IslamicCalendar *)UMemory::operator_new((UMemory *)0x268,(size_t)__fn);
  if (this_00 != (IslamicCalendar *)0x0) {
    IslamicCalendar(this_00,this);
  }
  return (int)this_00;
}

Assistant:

Calendar* IslamicCalendar::clone() const {
    return new IslamicCalendar(*this);
}